

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void test_key_exchange(ptls_key_exchange_algorithm_t *algo)

{
  int iVar1;
  undefined1 auStack_58 [4];
  int ret;
  ptls_iovec_t server_secret;
  ptls_iovec_t server_pubkey;
  ptls_iovec_t client_secret;
  ptls_iovec_t client_pubkey;
  ptls_key_exchange_context_t *ctx;
  ptls_key_exchange_algorithm_t *algo_local;
  
  iVar1 = (*algo->exchange)((ptls_iovec_t *)&server_secret.len,(ptls_iovec_t *)auStack_58,
                            (ptls_iovec_t)ZEXT816(0));
  _ok((uint)(iVar1 != 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0x158);
  iVar1 = (*algo->create)((ptls_key_exchange_context_t **)&client_pubkey.len,
                          (ptls_iovec_t *)&client_secret.len);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0x15c);
  iVar1 = (*algo->exchange)((ptls_iovec_t *)&server_secret.len,(ptls_iovec_t *)auStack_58,
                            stack0xffffffffffffffd8);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0x15e);
  iVar1 = (**(code **)client_pubkey.len)
                    (client_pubkey.len,&server_pubkey.len,server_secret.len,server_pubkey.base);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0x160);
  _ok((uint)(client_secret.base == server_secret.base),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0x161);
  iVar1 = memcmp((void *)server_pubkey.len,_auStack_58,(size_t)client_secret.base);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0x162);
  free((void *)server_pubkey.len);
  free((void *)server_secret.len);
  free(_auStack_58);
  return;
}

Assistant:

void test_key_exchange(ptls_key_exchange_algorithm_t *algo)
{
    ptls_key_exchange_context_t *ctx;
    ptls_iovec_t client_pubkey, client_secret, server_pubkey, server_secret;
    int ret;

    /* fail */
    ret = algo->exchange(&server_pubkey, &server_secret, (ptls_iovec_t){NULL});
    ok(ret != 0);

    /* perform ecdh */
    ret = algo->create(&ctx, &client_pubkey);
    ok(ret == 0);
    ret = algo->exchange(&server_pubkey, &server_secret, client_pubkey);
    ok(ret == 0);
    ret = ctx->on_exchange(ctx, &client_secret, server_pubkey);
    ok(ret == 0);
    ok(client_secret.len == server_secret.len);
    ok(memcmp(client_secret.base, server_secret.base, client_secret.len) == 0);

    free(client_secret.base);
    free(server_pubkey.base);
    free(server_secret.base);
}